

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

QList<QRect> *
QMdi::MinOverlapPlacer::getCandidatePlacements
          (QList<QRect> *__return_storage_ptr__,QSize *size,QList<QRect> *rects,QRect *domain)

{
  int iVar1;
  QRect *pQVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  ulong uVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  long in_FS_OFFSET;
  int *local_b0;
  QRect local_88;
  QList<int> local_78;
  QList<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QRect *)0x0;
  local_58.d.size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (int *)0x0;
  QList<int>::reserve(&local_58,(rects->d).size + 2);
  local_78.d.d._0_4_ = (domain->x1).m_i;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_58,local_58.d.size,(int *)&local_78);
  QList<int>::end(&local_58);
  local_78.d.d = (Data *)CONCAT44(local_78.d.d._4_4_,((domain->x2).m_i - (size->wd).m_i) + 1);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_58,local_58.d.size,(int *)&local_78);
  QList<int>::end(&local_58);
  local_78.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (int *)0x0;
  QList<int>::reserve(&local_78,(rects->d).size + 2);
  local_88.x1.m_i = (domain->y1).m_i;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_88);
  QList<int>::end(&local_78);
  iVar3 = (domain->y2).m_i - (size->ht).m_i;
  if (-2 < iVar3) {
    local_88.x1.m_i = iVar3 + 1;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_88);
    QList<int>::end(&local_78);
  }
  lVar9 = (rects->d).size;
  if (lVar9 != 0) {
    pQVar2 = (rects->d).ptr;
    lVar11 = 0;
    do {
      local_88.x1.m_i = *(int *)((long)&(pQVar2->x2).m_i + lVar11) + 1;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_58,local_58.d.size,(int *)&local_88);
      QList<int>::end(&local_58);
      local_88.x1.m_i = *(int *)((long)&(pQVar2->y2).m_i + lVar11) + 1;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_88);
      QList<int>::end(&local_78);
      lVar11 = lVar11 + 0x10;
    } while (lVar9 << 4 != lVar11);
  }
  iVar4 = QList<int>::begin(&local_58);
  iVar5 = QList<int>::end(&local_58);
  if (iVar4.i != iVar5.i) {
    uVar6 = (long)iVar5.i - (long)iVar4.i >> 2;
    lVar9 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar4.i,iVar5.i,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar4.i,iVar5.i);
  }
  iVar4 = QList<int>::begin(&local_58);
  iVar5 = QList<int>::end(&local_58);
  if (iVar4.i != iVar5.i) {
    piVar8 = iVar4.i + 1;
    do {
      piVar10 = piVar8;
      if (piVar10 == iVar5.i) goto LAB_0043e2dd;
      piVar8 = piVar10 + 1;
    } while (piVar10[-1] != *piVar10);
    piVar7 = piVar10 + -1;
    iVar3 = piVar10[-1];
    for (; piVar8 != iVar5.i; piVar8 = piVar8 + 1) {
      iVar1 = *piVar8;
      if (iVar3 != iVar1) {
        piVar7[1] = iVar1;
        piVar7 = piVar7 + 1;
      }
      iVar3 = iVar1;
    }
    iVar5.i = piVar7 + 1;
  }
LAB_0043e2dd:
  iVar4 = QList<int>::end(&local_58);
  QList<int>::erase(&local_58,(const_iterator)iVar5.i,(const_iterator)iVar4.i);
  iVar4 = QList<int>::begin(&local_78);
  iVar5 = QList<int>::end(&local_78);
  if (iVar4.i != iVar5.i) {
    uVar6 = (long)iVar5.i - (long)iVar4.i >> 2;
    lVar9 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar4.i,iVar5.i,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar4.i,iVar5.i);
  }
  iVar4 = QList<int>::begin(&local_78);
  iVar5 = QList<int>::end(&local_78);
  if (iVar4.i != iVar5.i) {
    piVar8 = iVar4.i + 1;
    do {
      piVar10 = piVar8;
      if (piVar10 == iVar5.i) goto LAB_0043e3a3;
      piVar8 = piVar10 + 1;
    } while (piVar10[-1] != *piVar10);
    piVar7 = piVar10 + -1;
    iVar3 = piVar10[-1];
    for (; piVar8 != iVar5.i; piVar8 = piVar8 + 1) {
      iVar1 = *piVar8;
      if (iVar3 != iVar1) {
        piVar7[1] = iVar1;
        piVar7 = piVar7 + 1;
      }
      iVar3 = iVar1;
    }
    iVar5.i = piVar7 + 1;
  }
LAB_0043e3a3:
  iVar4 = QList<int>::end(&local_78);
  QList<int>::erase(&local_78,(const_iterator)iVar5.i,(const_iterator)iVar4.i);
  QList<QRect>::reserve(__return_storage_ptr__,local_58.d.size * local_78.d.size);
  if (local_78.d.size != 0) {
    local_b0 = local_78.d.ptr;
    piVar8 = local_78.d.ptr + local_78.d.size;
    do {
      piVar10 = local_58.d.ptr;
      if (local_58.d.size != 0) {
        iVar3 = *local_b0;
        lVar11 = local_58.d.size << 2;
        lVar9 = 0;
        do {
          local_88.x1.m_i = *(int *)((long)piVar10 + lVar9);
          local_88.x2.m_i = local_88.x1.m_i + (size->wd).m_i + -1;
          local_88.y2.m_i = (size->ht).m_i + iVar3 + -1;
          local_88.y1.m_i = iVar3;
          QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                    ((QMovableArrayOps<QRect> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_88);
          QList<QRect>::end(__return_storage_ptr__);
          lVar9 = lVar9 + 4;
        } while (lVar11 != lVar9);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != piVar8);
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QRect> MinOverlapPlacer::getCandidatePlacements(const QSize &size, const QList<QRect> &rects,
                                                      const QRect &domain)
{
    QList<QRect> result;

    QList<int> xlist;
    xlist.reserve(2 + rects.size());
    xlist << domain.left() << domain.right() - size.width() + 1;

    QList<int> ylist;
    ylist.reserve(2 + rects.size());
    ylist << domain.top();
    if (domain.bottom() - size.height() + 1 >= 0)
        ylist << domain.bottom() - size.height() + 1;

    for (const QRect &rect : rects) {
        xlist << rect.right() + 1;
        ylist << rect.bottom() + 1;
    }

    std::sort(xlist.begin(), xlist.end());
    xlist.erase(std::unique(xlist.begin(), xlist.end()), xlist.end());

    std::sort(ylist.begin(), ylist.end());
    ylist.erase(std::unique(ylist.begin(), ylist.end()), ylist.end());

    result.reserve(ylist.size() * xlist.size());
    for (int y : std::as_const(ylist))
        for (int x : std::as_const(xlist))
            result << QRect(QPoint(x, y), size);
    return result;
}